

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead128.c
# Opt level: O3

size_t ascon_aead128_encrypt_final
                 (ascon_aead_ctx_t *ctx,uint8_t *ciphertext,uint8_t *tag,size_t tag_len)

{
  uint_fast8_t n;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong x;
  
  if ((ctx->bufstate).flow_state != '\x05') {
    ascon_aead128_80pq_finalise_assoc_data(ctx);
  }
  uVar7 = bigendian_decode_varlen((ctx->bufstate).buffer,(ctx->bufstate).buffer_len);
  n = (ctx->bufstate).buffer_len;
  x = 0x80L << ((ulong)(byte)(n * -8 + 0x38) & 0x3f) ^ uVar7 ^ (ctx->bufstate).sponge.x0;
  (ctx->bufstate).sponge.x0 = x;
  bigendian_encode_varlen(ciphertext,x,n);
  bVar1 = (ctx->bufstate).buffer_len;
  uVar2 = *(uint *)((long)&(ctx->bufstate).sponge.x1 + 4);
  uVar7 = (ctx->bufstate).sponge.x2;
  uVar3 = *(uint *)((long)&(ctx->bufstate).sponge.x2 + 4);
  uVar4 = *(uint *)((long)&ctx->k0 + 4);
  uVar6 = ctx->k1;
  uVar5 = *(uint *)((long)&ctx->k1 + 4);
  *(uint *)&(ctx->bufstate).sponge.x1 = (uint)(ctx->bufstate).sponge.x1 ^ (uint)ctx->k0;
  *(uint *)((long)&(ctx->bufstate).sponge.x1 + 4) = uVar2 ^ uVar4;
  *(uint *)&(ctx->bufstate).sponge.x2 = (uint)uVar7 ^ (uint)uVar6;
  *(uint *)((long)&(ctx->bufstate).sponge.x2 + 4) = uVar3 ^ uVar5;
  ascon_permutation_12((ascon_sponge_t *)ctx);
  uVar2 = *(uint *)((long)&(ctx->bufstate).sponge.x3 + 4);
  uVar7 = (ctx->bufstate).sponge.x4;
  uVar3 = *(uint *)((long)&(ctx->bufstate).sponge.x4 + 4);
  uVar4 = *(uint *)((long)&ctx->k0 + 4);
  uVar6 = ctx->k1;
  uVar5 = *(uint *)((long)&ctx->k1 + 4);
  *(uint *)&(ctx->bufstate).sponge.x3 = (uint)(ctx->bufstate).sponge.x3 ^ (uint)ctx->k0;
  *(uint *)((long)&(ctx->bufstate).sponge.x3 + 4) = uVar2 ^ uVar4;
  *(uint *)&(ctx->bufstate).sponge.x4 = (uint)uVar7 ^ (uint)uVar6;
  *(uint *)((long)&(ctx->bufstate).sponge.x4 + 4) = uVar3 ^ uVar5;
  ascon_aead_generate_tag(ctx,tag,tag_len);
  ascon_aead_cleanup(ctx);
  return (ulong)bVar1;
}

Assistant:

ASCON_API size_t
ascon_aead128_encrypt_final(ascon_aead_ctx_t* const ctx,
                            uint8_t* const ciphertext,
                            uint8_t* tag,
                            size_t tag_len)
{
    ASCON_ASSERT(ctx != NULL);
    ASCON_ASSERT(ciphertext != NULL);
    ASCON_ASSERT(tag_len == 0 || tag != NULL);
    ASCON_ASSERT(ctx->bufstate.flow_state == ASCON_FLOW_AEAD128_80pq_INITIALISED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128_80pq_ASSOC_DATA_UPDATED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128_80pq_ENCRYPT_UPDATED);
    if (ctx->bufstate.flow_state != ASCON_FLOW_AEAD128_80pq_ENCRYPT_UPDATED)
    {
        // Finalise the associated data if not already done sos.
        ascon_aead128_80pq_finalise_assoc_data(ctx);
    }
    size_t freshly_generated_ciphertext_len = 0;
    // If there is any remaining less-than-a-block plaintext to be absorbed
    // cached in the buffer, pad it and absorb it.
    ctx->bufstate.sponge.x0 ^= bigendian_decode_varlen(ctx->bufstate.buffer,
                                                       ctx->bufstate.buffer_len);
    ctx->bufstate.sponge.x0 ^= PADDING(ctx->bufstate.buffer_len);
    // Squeeze out last ciphertext bytes, if any.
    bigendian_encode_varlen(ciphertext, ctx->bufstate.sponge.x0, ctx->bufstate.buffer_len);
    freshly_generated_ciphertext_len += ctx->bufstate.buffer_len;
    // End of encryption, start of tag generation.
    // Apply key twice more with a permutation to set the state for the tag.
    ctx->bufstate.sponge.x1 ^= ctx->k0;
    ctx->bufstate.sponge.x2 ^= ctx->k1;
    ascon_permutation_12(&ctx->bufstate.sponge);
    ctx->bufstate.sponge.x3 ^= ctx->k0;
    ctx->bufstate.sponge.x4 ^= ctx->k1;
    // Squeeze out tag into its buffer.
    ascon_aead_generate_tag(ctx, tag, tag_len);
    // Final security cleanup of the internal state, key and buffer.
    ascon_aead_cleanup(ctx);
    return freshly_generated_ciphertext_len;
}